

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprTerm **ppFVar1;
  u8 uVar2;
  u32 nData;
  Fts5ExprPhrase *pFVar3;
  Fts5IndexIter *pFVar4;
  u8 *puVar5;
  Fts5ExprPhrase *pFVar6;
  bool bVar7;
  u8 *puVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  Fts5ExprTerm *p;
  Fts5ExprTerm *pFVar12;
  Fts5LookaheadReader *pFVar13;
  Fts5ExprTerm *p_1;
  Fts5ExprTerm *pFVar14;
  ulong uVar15;
  bool bVar16;
  Fts5ExprNearset *pFVar17;
  uint uVar18;
  ulong uVar19;
  Fts5ExprTerm *p_2;
  int *piVar20;
  long lVar21;
  long lVar22;
  Fts5Expr *pFVar23;
  long lVar24;
  i64 *piVar25;
  long lVar26;
  Fts5LookaheadReader *pFVar27;
  bool bVar28;
  int n;
  u8 *a;
  int rc;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  Fts5LookaheadReader *local_178;
  int local_164;
  Fts5ExprNearset *local_160;
  Fts5ExprTerm *local_158;
  undefined8 local_150;
  int local_144;
  Fts5ExprNode *local_140;
  Fts5Expr *local_138;
  u8 *local_130;
  Fts5Buffer local_128;
  int *local_110;
  Fts5Buffer *local_108;
  Fts5PoslistWriter local_100;
  Fts5LookaheadReader local_f8 [6];
  
  pFVar17 = pNode->pNear;
  pFVar3 = pFVar17->apPhrase[0];
  uVar18 = pExpr->bDesc;
  if (pFVar3->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    lVar24 = (pFVar3->aTerm[0].pIter)->iRowid;
  }
  else {
    pFVar12 = pFVar3->aTerm;
    lVar24 = 0;
    bVar16 = false;
    do {
      if ((pFVar12->pIter->bEof == '\0') &&
         ((lVar26 = pFVar12->pIter->iRowid, !bVar16 || (bVar16 = true, uVar18 != lVar26 < lVar24))))
      {
        bVar16 = true;
        lVar24 = lVar26;
      }
      pFVar12 = pFVar12->pSynonym;
    } while (pFVar12 != (Fts5ExprTerm *)0x0);
  }
  local_164 = 0;
  local_150 = pFVar17;
  local_140 = pNode;
  local_138 = pExpr;
  do {
    if (pFVar17->nPhrase < 1) {
      bVar16 = false;
    }
    else {
      bVar16 = true;
      local_160 = (Fts5ExprNearset *)0x0;
      do {
        pFVar3 = pFVar17->apPhrase[(long)local_160];
        if (pFVar3->nTerm < 1) {
          bVar28 = true;
        }
        else {
          local_158 = pFVar3->aTerm;
          lVar26 = 0;
          iVar11 = local_164;
          do {
            pFVar12 = local_158 + lVar26;
            local_164 = iVar11;
            if (local_158[lVar26].pSynonym == (Fts5ExprTerm *)0x0) {
              pFVar4 = pFVar12->pIter;
              lVar21 = pFVar4->iRowid;
              iVar10 = 9;
              if ((lVar21 == lVar24) || (pFVar4->bEof != '\0')) {
                bVar28 = false;
              }
              else {
                if ((uVar18 == 0 && lVar21 < lVar24) ||
                   (bVar16 = true, lVar22 = lVar21, uVar18 != 0 && lVar24 < lVar21)) {
                  iVar10 = sqlite3Fts5IterNextFrom(pFVar4,lVar24);
                  if ((iVar10 == 0) && (pFVar4->bEof == '\0')) {
                    lVar21 = pFVar4->iRowid;
                    bVar16 = true;
                  }
                  else {
                    local_140->bEof = 1;
                    bVar16 = false;
                    iVar11 = iVar10;
                  }
                  lVar22 = lVar24;
                  local_164 = iVar11;
                  if (bVar16) {
                    lVar22 = lVar21;
                  }
                }
                lVar24 = lVar22;
                if (bVar16) {
                  bVar28 = true;
                  bVar16 = false;
                  iVar10 = 0;
                }
                else {
                  iVar10 = 1;
                  bVar16 = false;
                  bVar28 = false;
                  local_178._0_4_ = local_164;
                }
              }
              if (bVar28) goto LAB_001a7023;
            }
            else {
              lVar21 = 0;
              bVar28 = false;
              pFVar14 = pFVar12;
              do {
                if ((pFVar14->pIter->bEof == '\0') &&
                   ((lVar22 = pFVar14->pIter->iRowid, !bVar28 ||
                    (bVar28 = true, uVar18 != lVar22 < lVar21)))) {
                  bVar28 = true;
                  lVar21 = lVar22;
                }
                pFVar14 = pFVar14->pSynonym;
              } while (pFVar14 != (Fts5ExprTerm *)0x0);
              pFVar14 = pFVar12;
              if (lVar21 == lVar24) {
                iVar10 = 9;
                bVar7 = false;
              }
              else {
                do {
                  pFVar4 = pFVar14->pIter;
                  local_164 = 0;
                  if (pFVar4->bEof == '\0') {
                    if ((uVar18 == 0 && pFVar4->iRowid < lVar24) ||
                       (uVar18 != 0 && lVar24 < pFVar4->iRowid)) {
                      local_164 = sqlite3Fts5IterNextFrom(pFVar4,lVar24);
                    }
                  }
                } while ((local_164 == 0) &&
                        (ppFVar1 = &pFVar14->pSynonym, pFVar14 = *ppFVar1,
                        *ppFVar1 != (Fts5ExprTerm *)0x0));
                bVar16 = false;
                bVar28 = false;
                if (local_164 == 0) {
                  lVar24 = 0;
                  bVar28 = false;
                  do {
                    if ((pFVar12->pIter->bEof == '\0') &&
                       ((lVar21 = pFVar12->pIter->iRowid, !bVar28 ||
                        (bVar28 = true, uVar18 != lVar21 < lVar24)))) {
                      bVar28 = true;
                      lVar24 = lVar21;
                    }
                    pFVar12 = pFVar12->pSynonym;
                    local_164 = iVar11;
                  } while (pFVar12 != (Fts5ExprTerm *)0x0);
                }
                bVar7 = true;
                if (bVar28) {
                  iVar10 = 0;
                }
                else {
                  local_140->bEof = 1;
                  local_140->bNomatch = 0;
                  iVar10 = 1;
                  bVar16 = false;
                  bVar7 = false;
                  local_178._0_4_ = local_164;
                }
              }
              if (bVar7) {
LAB_001a7023:
                iVar10 = 0;
              }
            }
            if ((iVar10 != 9) && (iVar10 != 0)) goto LAB_001a70c5;
            lVar26 = lVar26 + 1;
            iVar11 = local_164;
          } while (lVar26 < pFVar3->nTerm);
          iVar10 = 0;
LAB_001a70c5:
          bVar28 = iVar10 == 0;
          pFVar17 = local_150;
        }
        if (!bVar28) {
          return (int)local_178;
        }
        local_160 = (Fts5ExprNearset *)((long)local_160 + 1);
      } while ((long)local_160 < (long)pFVar17->nPhrase);
      bVar16 = !bVar16;
    }
  } while (bVar16);
  local_140->iRowid = lVar24;
  pFVar17 = local_140->pNear;
  if (local_138->pConfig->eDetail == 0) {
    pFVar23 = (Fts5Expr *)0x0;
    local_160 = pFVar17;
    if (local_164 == 0) {
      pFVar23 = (Fts5Expr *)0x0;
      do {
        if ((long)pFVar17->nPhrase <= (long)pFVar23) break;
        pFVar3 = pFVar17->apPhrase[(long)pFVar23];
        if ((((1 < pFVar3->nTerm) || (pFVar3->aTerm[0].pSynonym != (Fts5ExprTerm *)0x0)) ||
            (pFVar17->pColset != (Fts5Colset *)0x0)) || (pFVar3->aTerm[0].bFirst != '\0')) {
          local_100.iPrev = 0;
          uVar2 = pFVar3->aTerm[0].bFirst;
          (pFVar3->poslist).n = 0;
          iVar11 = pFVar3->nTerm;
          local_178 = local_f8;
          local_138 = pFVar23;
          if ((long)iVar11 < 5) {
LAB_001a721b:
            local_150 = (Fts5ExprNearset *)((ulong)local_150 & 0xffffffff00000000);
            memset(local_178,0,(long)pFVar3->nTerm << 5);
            if (0 < pFVar3->nTerm) {
              piVar20 = &local_178->i;
              lVar24 = 0;
              local_150 = (Fts5ExprNearset *)((ulong)local_150 & 0xffffffff00000000);
              pFVar6 = pFVar3;
              do {
                local_144 = 0;
                local_130 = (u8 *)0x0;
                if (pFVar6->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
                  pFVar4 = pFVar6->aTerm[0].pIter;
                  local_130 = pFVar4->pData;
                  local_144 = pFVar4->nData;
                  bVar16 = false;
LAB_001a72e6:
                  ((Fts5LookaheadReader *)(piVar20 + -3))->a = (u8 *)0x0;
                  *(undefined8 *)(piVar20 + -1) = 0;
                  *(i64 *)(piVar20 + 1) = 0;
                  *(i64 *)(piVar20 + 3) = 0;
                  ((Fts5LookaheadReader *)(piVar20 + -3))->a = local_130;
                  piVar20[-1] = local_144;
                  iVar11 = sqlite3Fts5PoslistNext64
                                     (local_130,local_144,piVar20,(i64 *)(piVar20 + 3));
                  if (iVar11 != 0) {
                    *(undefined1 *)((long)piVar20 + 5) = 1;
                  }
                  *(bool *)(piVar20 + 1) = bVar16;
                  cVar9 = (*(char *)((long)piVar20 + 5) != '\0') * '\x05';
                }
                else {
                  local_128.p = (u8 *)0x0;
                  local_128.n = 0;
                  local_128.nSpace = 0;
                  iVar11 = fts5ExprSynonymList(pFVar6->aTerm,local_140->iRowid,&local_128,&local_130
                                               ,&local_144);
                  puVar8 = local_128.p;
                  puVar5 = local_130;
                  local_150 = (Fts5ExprNearset *)CONCAT44(local_150._4_4_,iVar11);
                  if (iVar11 == 0) {
                    cVar9 = '\0';
                  }
                  else {
                    sqlite3_free(local_130);
                    cVar9 = '\x05';
                  }
                  bVar16 = iVar11 == 0 && puVar5 == puVar8;
                  if ((int)local_150 == 0) goto LAB_001a72e6;
                }
                if (cVar9 != '\0') {
                  if (cVar9 != '\x05') goto LAB_001a7597;
                  goto LAB_001a74f8;
                }
                lVar24 = lVar24 + 1;
                piVar20 = piVar20 + 8;
                pFVar6 = (Fts5ExprPhrase *)pFVar6->aTerm;
              } while (lVar24 < pFVar3->nTerm);
            }
            local_108 = &pFVar3->poslist;
            local_110 = &local_178->i;
            do {
              local_158 = (Fts5ExprTerm *)local_178->iLookahead;
              do {
                if (pFVar3->nTerm < 1) {
                  bVar16 = false;
                }
                else {
                  bVar16 = true;
                  lVar24 = 0;
                  do {
                    puVar5 = &local_158->bPrefix + lVar24;
                    iVar11 = 0;
                    bVar28 = true;
                    if ((undefined1 *)local_178[lVar24].iLookahead != puVar5) {
                      pFVar13 = local_178 + lVar24;
                      do {
                        lVar26 = local_178[lVar24].iLookahead;
                        if ((long)puVar5 <= lVar26) {
                          if ((long)puVar5 < lVar26) {
                            local_158 = (Fts5ExprTerm *)(lVar26 - lVar24);
                          }
                          iVar11 = 0;
                          goto LAB_001a740d;
                        }
                        iVar11 = sqlite3Fts5PoslistNext64
                                           (pFVar13->a,pFVar13->n,&pFVar13->i,
                                            &local_178[lVar24].iLookahead);
                        if (iVar11 != 0) {
                          *(undefined1 *)((long)&pFVar13->iPos + 1) = 1;
                        }
                      } while (*(char *)((long)&pFVar13->iPos + 1) == '\0');
                      bVar28 = false;
                      iVar11 = 5;
LAB_001a740d:
                      bVar16 = false;
                    }
                    if (!bVar28) goto LAB_001a74d5;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < pFVar3->nTerm);
                  bVar16 = !bVar16;
                }
              } while (bVar16);
              if ((uVar2 == '\0') || (((ulong)local_158 & 0x7fffffff) == 0)) {
                iVar11 = sqlite3Fts5PoslistWriterAppend(local_108,&local_100,(i64)local_158);
                local_150 = (Fts5ExprNearset *)CONCAT44(local_150._4_4_,iVar11);
                if (iVar11 == 0) {
                  local_150 = (Fts5ExprNearset *)((ulong)local_150._4_4_ << 0x20);
                  goto LAB_001a7482;
                }
                iVar11 = 5;
              }
              else {
LAB_001a7482:
                iVar11 = 0;
                if (0 < pFVar3->nTerm) {
                  lVar24 = 0;
                  piVar20 = local_110;
                  do {
                    iVar11 = sqlite3Fts5PoslistNext64
                                       (((Fts5LookaheadReader *)(piVar20 + -3))->a,piVar20[-1],
                                        piVar20,(i64 *)(piVar20 + 3));
                    if (iVar11 != 0) {
                      *(undefined1 *)((long)piVar20 + 5) = 1;
                    }
                    if (*(char *)((long)piVar20 + 5) != '\0') {
                      iVar11 = 5;
                      break;
                    }
                    lVar24 = lVar24 + 1;
                    piVar20 = piVar20 + 8;
                    iVar11 = 0;
                  } while (lVar24 < pFVar3->nTerm);
                }
              }
LAB_001a74d5:
            } while (iVar11 == 0);
            if (iVar11 == 5) {
LAB_001a74f8:
              iVar11 = (pFVar3->poslist).n;
              if (0 < pFVar3->nTerm) {
                piVar25 = &local_178->iPos;
                lVar24 = 0;
                do {
                  if ((char)*piVar25 != '\0') {
                    sqlite3_free(((Fts5LookaheadReader *)(piVar25 + -2))->a);
                  }
                  lVar24 = lVar24 + 1;
                  piVar25 = piVar25 + 4;
                } while (lVar24 < pFVar3->nTerm);
              }
              if (local_178 != local_f8) {
                sqlite3_free(local_178);
              }
              local_164 = (int)local_150;
              pFVar17 = local_160;
              pFVar23 = local_138;
              if (0 < iVar11) goto LAB_001a7561;
              break;
            }
          }
          else {
            iVar10 = sqlite3_initialize();
            if (iVar10 == 0) {
              local_178 = (Fts5LookaheadReader *)sqlite3Malloc((long)iVar11 << 5);
            }
            else {
              local_178 = (Fts5LookaheadReader *)0x0;
            }
            if (local_178 != (Fts5LookaheadReader *)0x0) goto LAB_001a721b;
          }
LAB_001a7597:
          local_164 = 7;
          pFVar17 = local_160;
          pFVar23 = local_138;
          break;
        }
        pFVar4 = pFVar3->aTerm[0].pIter;
        nData = pFVar4->nData;
        puVar5 = pFVar4->pData;
        (pFVar3->poslist).n = 0;
        sqlite3Fts5BufferAppendBlob(&local_164,&pFVar3->poslist,nData,puVar5);
LAB_001a7561:
        pFVar23 = (Fts5Expr *)((long)&pFVar23->pIndex + 1);
      } while (local_164 == 0);
    }
    iVar11 = local_164;
    uVar18 = 0;
    if (((int)pFVar23 == pFVar17->nPhrase) && (uVar18 = 1, (int)pFVar23 != 1)) {
      local_128.p = (u8 *)CONCAT44(local_128.p._4_4_,local_164);
      if ((long)pFVar17->nPhrase < 5) {
        pFVar13 = local_f8;
        memset(pFVar13,0,0xc0);
      }
      else {
        pFVar13 = (Fts5LookaheadReader *)
                  sqlite3Fts5MallocZero((int *)&local_128,(long)pFVar17->nPhrase * 0x30);
      }
      pFVar17 = local_160;
      if ((int)local_128.p == 0) {
        if (0 < local_160->nPhrase) {
          lVar24 = 0;
          pFVar27 = pFVar13;
          do {
            pFVar3 = pFVar17->apPhrase[lVar24];
            puVar5 = (pFVar3->poslist).p;
            iVar10 = (pFVar3->poslist).n;
            pFVar27->a = (u8 *)0x0;
            pFVar27->n = 0;
            pFVar27->i = 0;
            pFVar27->iPos = 0;
            pFVar27->iLookahead = 0;
            pFVar27->a = puVar5;
            pFVar27->n = iVar10;
            fts5LookaheadReaderNext(pFVar27);
            fts5LookaheadReaderNext(pFVar27);
            (pFVar3->poslist).n = 0;
            *(Fts5Buffer **)&pFVar27[1].n = &pFVar3->poslist;
            lVar24 = lVar24 + 1;
            pFVar27 = (Fts5LookaheadReader *)&pFVar27[1].iPos;
          } while (lVar24 < pFVar17->nPhrase);
        }
        local_158 = (Fts5ExprTerm *)&pFVar13->iLookahead;
        do {
          lVar24 = pFVar13->iPos;
          do {
            if (local_160->nPhrase < 1) {
              bVar16 = false;
            }
            else {
              bVar16 = true;
              pFVar17 = (Fts5ExprNearset *)0x0;
              do {
                lVar21 = lVar24 - ((long)local_160->nNear +
                                  (long)local_160->apPhrase[(long)pFVar17]->nTerm);
                lVar26 = *(long *)((long)pFVar13 + (long)pFVar17 * 0x30 + 0x10);
                bVar28 = true;
                if ((lVar24 < lVar26) || (iVar10 = 0, lVar26 < lVar21)) {
                  pFVar27 = (Fts5LookaheadReader *)((long)pFVar17 * 0x30 + (long)pFVar13);
                  do {
                    lVar26 = pFVar27->iPos;
                    if (lVar21 <= lVar26) {
                      if (lVar24 < lVar26) {
                        lVar24 = lVar26;
                      }
                      iVar10 = 0;
                      goto LAB_001a770f;
                    }
                    iVar10 = fts5LookaheadReaderNext(pFVar27);
                  } while (iVar10 == 0);
                  bVar28 = false;
                  iVar10 = 0xe;
LAB_001a770f:
                  bVar16 = false;
                }
                if (!bVar28) goto LAB_001a77cb;
                pFVar17 = (Fts5ExprNearset *)((long)&pFVar17->nNear + 1);
              } while ((long)pFVar17 < (long)local_160->nPhrase);
              bVar16 = !bVar16;
            }
          } while (bVar16);
          uVar18 = local_160->nPhrase;
          if (0 < (int)uVar18) {
            lVar24 = 0;
            pFVar27 = pFVar13 + 1;
            do {
              if (((*(Fts5Buffer **)&pFVar27->n)->n == 0) || ((u8 *)pFVar27[-1].iPos != pFVar27->a))
              {
                sqlite3Fts5PoslistWriterAppend
                          (*(Fts5Buffer **)&pFVar27->n,(Fts5PoslistWriter *)pFVar27,pFVar27[-1].iPos
                          );
              }
              lVar24 = lVar24 + 1;
              uVar18 = local_160->nPhrase;
              pFVar27 = (Fts5LookaheadReader *)&pFVar27[1].iPos;
            } while (lVar24 < (int)uVar18);
          }
          if ((int)uVar18 < 1) {
            lVar24 = 0;
          }
          else {
            lVar24._0_1_ = local_158->bPrefix;
            lVar24._1_1_ = local_158->bFirst;
            lVar24._2_6_ = *(undefined6 *)&local_158->field_0x2;
            uVar15 = 0;
            uVar19 = 0;
            pFVar12 = local_158;
            do {
              if (*(long *)pFVar12 < lVar24) {
                uVar19 = uVar15 & 0xffffffff;
                lVar24 = *(long *)pFVar12;
              }
              uVar15 = uVar15 + 1;
              pFVar12 = (Fts5ExprTerm *)((long)pFVar12 + 0x30);
            } while (uVar18 != uVar15);
            lVar24 = (long)(int)uVar19;
          }
          iVar10 = fts5LookaheadReaderNext((Fts5LookaheadReader *)(lVar24 * 0x30 + (long)pFVar13));
          if (iVar10 != 0) {
            iVar10 = 0xe;
          }
LAB_001a77cb:
          uVar18 = (uint)pFVar17;
        } while (iVar10 == 0);
        if (iVar10 == 0xe) {
          uVar18 = (uint)(0 < *(int *)(*(long *)&pFVar13[1].n + 8));
          iVar11 = (int)local_128.p;
          if (pFVar13 != local_f8) {
            sqlite3_free(pFVar13);
          }
        }
      }
      else {
        uVar18 = 0;
        iVar11 = (int)local_128.p;
      }
      uVar18 = uVar18 & 1;
    }
  }
  else {
    pFVar3 = pFVar17->apPhrase[0];
    (pFVar3->poslist).n = 0;
    pFVar12 = pFVar3->aTerm;
    do {
      pFVar4 = pFVar12->pIter;
      if (((pFVar4->bEof == '\0') && (pFVar4->iRowid == lVar24)) && (0 < pFVar4->nData)) {
        (pFVar3->poslist).n = 1;
      }
      pFVar12 = pFVar12->pSynonym;
    } while (pFVar12 != (Fts5ExprTerm *)0x0);
    uVar18 = (pFVar3->poslist).n;
    iVar11 = local_164;
  }
  local_140->bNomatch = (uint)(uVar18 == 0 && iVar11 == 0);
  return iVar11;
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1 
       || pNear->apPhrase[0]->nTerm>1 
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast || pIter->bEof ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}